

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O0

void __thiscall
unodb::qsbr::register_dealloc_stats_per_thread_between_epoch_changes
          (qsbr *this,size_t total_size,size_t count)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> guard;
  size_t count_local;
  size_t total_size_local;
  qsbr *this_local;
  
  guard._M_device = (mutex_type *)count;
  count_local = total_size;
  total_size_local = (size_t)this;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->dealloc_stats_lock);
  boost::accumulators::
  accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
  ::operator()((accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
                *)&this->deallocation_size_per_thread_stats,&count_local);
  publish_deallocation_size_stats(this);
  boost::accumulators::
  accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
  ::operator()((accumulator_set<unsigned_long,boost::accumulators::stats<boost::accumulators::tag::max,boost::accumulators::tag::variance,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,void>
                *)&this->epoch_dealloc_per_thread_count_stats,&guard);
  publish_epoch_callback_stats(this);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void register_dealloc_stats_per_thread_between_epoch_changes(
      std::size_t total_size, std::size_t count) {
    const std::lock_guard guard{dealloc_stats_lock};
    deallocation_size_per_thread_stats(total_size);
    publish_deallocation_size_stats();
    epoch_dealloc_per_thread_count_stats(count);
    publish_epoch_callback_stats();
  }